

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixer_sse.cpp
# Opt level: O0

float * Resample_<BSincTag,SSETag>
                  (InterpState *state,float *src,uint frac,uint increment,
                  span<float,_18446744073709551615UL> dst)

{
  float fVar1;
  float fVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  iterator pfVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  pointer pfVar21;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  float *in_RDI;
  float fVar22;
  __m128 f4;
  size_t j;
  size_t td;
  float *spd;
  float *scd;
  float *phd;
  float *fil;
  __m128 pf4;
  __m128 r4;
  float pf;
  uint pi;
  float *out_sample;
  iterator __end1;
  iterator __begin1;
  span<float,_18446744073709551615UL> *__range1;
  size_t m;
  __m128 sf4;
  float *filter;
  long local_2b8;
  ulong local_2b0;
  undefined8 local_278;
  undefined8 uStack_270;
  iterator local_250;
  uint local_21c;
  long local_218;
  span<float,_18446744073709551615UL> local_208;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar3 = *(long *)(in_RDI + 4);
  fVar1 = *in_RDI;
  fVar2 = in_RDI[1];
  uVar16 = (ulong)(uint)fVar2;
  local_218 = in_RSI + (ulong)(uint)in_RDI[2] * -4;
  local_1d8 = fVar1;
  fStack_1d4 = fVar1;
  fStack_1d0 = fVar1;
  fStack_1cc = fVar1;
  local_1bc = fVar1;
  local_250 = al::span<float,_18446744073709551615UL>::begin(&local_208);
  pfVar17 = al::span<float,_18446744073709551615UL>::end(&local_208);
  local_21c = in_EDX;
  for (; local_250 != pfVar17; local_250 = local_250 + 1) {
    local_1f8 = (float)(local_21c & 0x7f) * 0.0078125;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_98 = CONCAT44(local_1f8,local_1f8);
    uStack_90 = CONCAT44(local_1f8,local_1f8);
    lVar18 = lVar3 + uVar16 * (local_21c >> 7) * 0x10;
    lVar19 = lVar18 + uVar16 * 4;
    lVar20 = lVar19 + uVar16 * 4;
    local_2b0 = (ulong)((uint)fVar2 >> 2);
    local_2b8 = 0;
    do {
      local_d0 = (undefined8 *)(lVar18 + local_2b8 * 4);
      uVar4 = *local_d0;
      uVar5 = local_d0[1];
      local_d8 = (undefined8 *)(lVar20 + local_2b8 * 4);
      uVar6 = *local_d8;
      uVar7 = local_d8[1];
      local_68._0_4_ = (float)uVar6;
      local_68._4_4_ = (float)((ulong)uVar6 >> 0x20);
      uStack_60._0_4_ = (float)uVar7;
      uStack_60._4_4_ = (float)((ulong)uVar7 >> 0x20);
      local_108 = fVar1 * (float)local_68;
      fStack_104 = fVar1 * local_68._4_4_;
      fStack_100 = fVar1 * (float)uStack_60;
      fStack_fc = fVar1 * uStack_60._4_4_;
      local_f8._0_4_ = (float)uVar4;
      local_f8._4_4_ = (float)((ulong)uVar4 >> 0x20);
      uStack_f0._0_4_ = (float)uVar5;
      uStack_f0._4_4_ = (float)((ulong)uVar5 >> 0x20);
      local_138 = (float)local_f8 + local_108;
      fStack_134 = local_f8._4_4_ + fStack_104;
      fStack_130 = (float)uStack_f0 + fStack_100;
      fStack_12c = uStack_f0._4_4_ + fStack_fc;
      local_e0 = (undefined8 *)(lVar19 + local_2b8 * 4);
      uVar8 = *local_e0;
      uVar9 = local_e0[1];
      local_e8 = (undefined8 *)(lVar20 + uVar16 * 4 + local_2b8 * 4);
      uVar10 = *local_e8;
      uVar11 = local_e8[1];
      local_88._0_4_ = (float)uVar10;
      local_88._4_4_ = (float)((ulong)uVar10 >> 0x20);
      uStack_80._0_4_ = (float)uVar11;
      uStack_80._4_4_ = (float)((ulong)uVar11 >> 0x20);
      local_128 = fVar1 * (float)local_88;
      fStack_124 = fVar1 * local_88._4_4_;
      fStack_120 = fVar1 * (float)uStack_80;
      fStack_11c = fVar1 * uStack_80._4_4_;
      local_118._0_4_ = (float)uVar8;
      local_118._4_4_ = (float)((ulong)uVar8 >> 0x20);
      uStack_110._0_4_ = (float)uVar9;
      uStack_110._4_4_ = (float)((ulong)uVar9 >> 0x20);
      local_a8 = (float)local_118 + local_128;
      fStack_a4 = local_118._4_4_ + fStack_124;
      fStack_a0 = (float)uStack_110 + fStack_120;
      fStack_9c = uStack_110._4_4_ + fStack_11c;
      local_148 = local_1f8 * local_a8;
      fStack_144 = local_1f8 * fStack_a4;
      fStack_140 = local_1f8 * fStack_a0;
      fStack_13c = local_1f8 * fStack_9c;
      uVar12 = local_278;
      uVar13 = uStack_270;
      local_b8 = CONCAT44(fStack_134 + fStack_144,local_138 + local_148);
      uStack_b0 = CONCAT44(fStack_12c + fStack_13c,fStack_130 + fStack_140);
      local_40 = (undefined8 *)(local_218 + local_2b8 * 4);
      uVar14 = *local_40;
      uVar15 = local_40[1];
      local_c8._0_4_ = (float)uVar14;
      local_c8._4_4_ = (float)((ulong)uVar14 >> 0x20);
      uStack_c0._0_4_ = (float)uVar15;
      uStack_c0._4_4_ = (float)((ulong)uVar15 >> 0x20);
      local_168 = (local_138 + local_148) * (float)local_c8;
      fStack_164 = (fStack_134 + fStack_144) * local_c8._4_4_;
      fStack_160 = (fStack_130 + fStack_140) * (float)uStack_c0;
      fStack_15c = (fStack_12c + fStack_13c) * uStack_c0._4_4_;
      local_158._0_4_ = (float)local_278;
      local_158._4_4_ = (float)((ulong)local_278 >> 0x20);
      uStack_150._0_4_ = (float)uStack_270;
      uStack_150._4_4_ = (float)((ulong)uStack_270 >> 0x20);
      fStack_17c = (float)local_158 + local_168;
      fStack_180 = local_158._4_4_ + fStack_164;
      fStack_184 = (float)uStack_150 + fStack_160;
      local_188 = uStack_150._4_4_ + fStack_15c;
      local_278 = CONCAT44(fStack_180,fStack_17c);
      uStack_270 = CONCAT44(local_188,fStack_184);
      local_2b8 = local_2b8 + 4;
      local_2b0 = local_2b0 - 1;
    } while (local_2b0 != 0);
    local_1a8 = fStack_184 + fStack_180;
    fStack_1a4 = local_188 + fStack_17c;
    local_278 = CONCAT44(fStack_180 + fStack_184,fStack_17c + local_188);
    uStack_270 = CONCAT44(fStack_1a4,local_1a8);
    local_198 = local_278;
    uStack_190 = uStack_270;
    fVar22 = fStack_17c + local_188 + local_1a8;
    local_278 = CONCAT44(fStack_180 + fStack_184 + fStack_1a4,fVar22);
    uStack_270 = CONCAT44(fStack_1a4 + fStack_1a4,local_1a8 + local_1a8);
    local_18 = local_278;
    uStack_10 = uStack_270;
    *local_250 = fVar22;
    local_218 = local_218 + (ulong)(in_ECX + local_21c >> 0xc) * 4;
    local_21c = in_ECX + local_21c & 0xfff;
    fStack_1f4 = local_1f8;
    fStack_1f0 = local_1f8;
    fStack_1ec = local_1f8;
    local_1dc = local_1f8;
    fStack_1a0 = local_1a8;
    fStack_19c = fStack_1a4;
    local_178 = fStack_17c;
    fStack_174 = fStack_180;
    fStack_170 = fStack_184;
    fStack_16c = local_188;
    local_158 = uVar12;
    uStack_150 = uVar13;
    local_118 = uVar8;
    uStack_110 = uVar9;
    local_f8 = uVar4;
    uStack_f0 = uVar5;
    local_c8 = uVar14;
    uStack_c0 = uVar15;
    local_88 = uVar10;
    uStack_80 = uVar11;
    local_78 = CONCAT44(fVar1,fVar1);
    uStack_70 = CONCAT44(fVar1,fVar1);
    local_68 = uVar6;
    uStack_60 = uVar7;
    local_58 = CONCAT44(fVar1,fVar1);
    uStack_50 = CONCAT44(fVar1,fVar1);
    local_38 = local_198;
    uStack_30 = uStack_190;
    local_28 = local_198;
    uStack_20 = uStack_190;
  }
  pfVar21 = al::span<float,_18446744073709551615UL>::data(&local_208);
  return pfVar21;
}

Assistant:

const float *Resample_<BSincTag,SSETag>(const InterpState *state, const float *RESTRICT src,
    uint frac, uint increment, const al::span<float> dst)
{
    const float *const filter{state->bsinc.filter};
    const __m128 sf4{_mm_set1_ps(state->bsinc.sf)};
    const size_t m{state->bsinc.m};

    src -= state->bsinc.l;
    for(float &out_sample : dst)
    {
        // Calculate the phase index and factor.
        const uint pi{frac >> FracPhaseBitDiff};
        const float pf{static_cast<float>(frac & (FracPhaseDiffOne-1)) * (1.0f/FracPhaseDiffOne)};

        // Apply the scale and phase interpolated filter.
        __m128 r4{_mm_setzero_ps()};
        {
            const __m128 pf4{_mm_set1_ps(pf)};
            const float *fil{filter + m*pi*4};
            const float *phd{fil + m};
            const float *scd{phd + m};
            const float *spd{scd + m};
            size_t td{m >> 2};
            size_t j{0u};

            do {
                /* f = ((fil + sf*scd) + pf*(phd + sf*spd)) */
                const __m128 f4 = MLA4(
                    MLA4(_mm_load_ps(&fil[j]), sf4, _mm_load_ps(&scd[j])),
                    pf4, MLA4(_mm_load_ps(&phd[j]), sf4, _mm_load_ps(&spd[j])));
                /* r += f*src */
                r4 = MLA4(r4, f4, _mm_loadu_ps(&src[j]));
                j += 4;
            } while(--td);
        }
        r4 = _mm_add_ps(r4, _mm_shuffle_ps(r4, r4, _MM_SHUFFLE(0, 1, 2, 3)));
        r4 = _mm_add_ps(r4, _mm_movehl_ps(r4, r4));
        out_sample = _mm_cvtss_f32(r4);

        frac += increment;
        src  += frac>>MixerFracBits;
        frac &= MixerFracMask;
    }
    return dst.data();
}